

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::socks5::on_name_lookup
          (socks5 *this,error_code *e,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *ips)

{
  implementation_type *impl;
  socket *this_00;
  listen_socket_handle *this_01;
  endpoint *this_02;
  alert_manager *paVar1;
  pointer paVar2;
  bool bVar3;
  long lVar4;
  address *a;
  pointer a_00;
  error_code ec;
  endpoint bind_ep;
  error_code local_a8;
  undefined1 local_98 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  data_union local_78;
  pointer local_58;
  error_code local_50 [2];
  
  if (this->m_abort != false) {
    return;
  }
  if ((e->val_ == 0x7d) && (e->cat_->id_ == 0x8fafd21e25c5e09b)) {
    return;
  }
  if (e->failed_ == true) {
    paVar1 = this->m_alerts;
    if (((paVar1->m_alert_mask)._M_i.m_val & 1) != 0) {
      listen_socket_handle::get_local_endpoint((endpoint *)local_98,&this->m_listen_socket);
      local_50[0].val_ = CONCAT31(local_50[0].val_._1_3_,0x26);
      alert_manager::
      emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,libtorrent::operation_t,boost::system::error_code_const&>
                (paVar1,(endpoint *)local_98,(operation_t *)local_50,e);
    }
    goto LAB_00384c75;
  }
  a_00 = (ips->
         super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>).
         _M_impl.super__Vector_impl_data._M_start;
  local_58 = (ips->
             super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)local_58 - (long)a_00 >> 7;
  if (0 < lVar4) {
    this_01 = &this->m_listen_socket;
    lVar4 = lVar4 + 1;
    do {
      bVar3 = listen_socket_handle::can_route(this_01,a_00);
      a = a_00;
      if (bVar3) goto LAB_003849d6;
      bVar3 = listen_socket_handle::can_route(this_01,a_00 + 1);
      a = a_00 + 1;
      if (bVar3) goto LAB_003849d6;
      bVar3 = listen_socket_handle::can_route(this_01,a_00 + 2);
      a = a_00 + 2;
      if (bVar3) goto LAB_003849d6;
      bVar3 = listen_socket_handle::can_route(this_01,a_00 + 3);
      a = a_00 + 3;
      if (bVar3) goto LAB_003849d6;
      a_00 = a_00 + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  paVar2 = local_58;
  lVar4 = (long)local_58 - (long)a_00 >> 5;
  if (lVar4 == 1) {
LAB_003849c1:
    bVar3 = listen_socket_handle::can_route(&this->m_listen_socket,a_00);
    a = paVar2;
    if (bVar3) {
      a = a_00;
    }
  }
  else {
    a = a_00;
    if (lVar4 == 2) {
LAB_003849a5:
      bVar3 = listen_socket_handle::can_route(&this->m_listen_socket,a);
      if (!bVar3) {
        a_00 = a + 1;
        goto LAB_003849c1;
      }
    }
    else {
      a = paVar2;
      if ((lVar4 == 3) &&
         (bVar3 = listen_socket_handle::can_route(&this->m_listen_socket,a_00), a = a_00, !bVar3)) {
        a = a_00 + 1;
        goto LAB_003849a5;
      }
    }
  }
LAB_003849d6:
  if (a == (ips->
           super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>).
           _M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = this->m_alerts;
    if (((paVar1->m_alert_mask)._M_i.m_val & 1) != 0) {
      listen_socket_handle::get_local_endpoint((endpoint *)local_98,&this->m_listen_socket);
      local_78.base.sa_family._0_1_ = 0x26;
      local_50[0].val_ = 0x71;
      local_50[0].failed_ = true;
      local_50[0].cat_ =
           &boost::system::detail::cat_holder<void>::generic_category_instance.super_error_category;
      alert_manager::
      emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,libtorrent::operation_t,boost::system::error_code>
                (paVar1,(endpoint *)local_98,(operation_t *)&local_78,local_50);
    }
  }
  else {
    this_02 = &this->m_proxy_addr;
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(this_02,a);
    local_a8.val_ = 0;
    local_a8.failed_ = false;
    local_a8.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    local_98._0_4_ = (uint)((this->m_proxy_addr).impl_.data_.base.sa_family != 2) * 8 + 2;
    impl = &(this->m_socks5_sock).
            super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            .
            super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            .impl_.implementation_;
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::open
              ((this->m_socks5_sock).
               super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .
               super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .impl_.service_,(char *)impl,(int)local_98,&local_a8);
    if (local_a8.failed_ == true) {
      if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) == 0) {
        return;
      }
      local_98[0] = 0xc;
      alert_manager::
      emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code&>
                (this->m_alerts,this_02,local_98,&local_a8);
      return;
    }
    this_00 = &this->m_socks5_sock;
    local_98._0_4_ = 1;
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
    set_option<boost::asio::detail::socket_option::boolean<1,9>>
              ((this_00->
               super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               ).
               super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .impl_.service_,impl,(boolean<1,_9> *)local_98,&local_a8);
    if (local_a8.failed_ == true) {
      if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0) {
        local_98[0] = 0x29;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code&>
                  (this->m_alerts,this_02,local_98,&local_a8);
      }
      local_a8.val_ = 0;
      local_a8.failed_ = false;
      local_a8.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    }
    local_98._0_4_ = 0x1e;
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
    set_option<libtorrent::aux::tcp_keepalive_idle>
              ((this_00->
               super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               ).
               super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .impl_.service_,impl,(tcp_keepalive_idle *)local_98,&local_a8);
    if (local_a8.failed_ == true) {
      if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0) {
        local_98[0] = 0x29;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code&>
                  (this->m_alerts,this_02,local_98,&local_a8);
      }
      local_a8.val_ = 0;
      local_a8.failed_ = false;
      local_a8.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    }
    local_98._0_4_ = 1;
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
    set_option<libtorrent::aux::tcp_keepalive_interval>
              ((this_00->
               super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               ).
               super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .impl_.service_,impl,(tcp_keepalive_interval *)local_98,&local_a8);
    if (local_a8.failed_ == true) {
      if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0) {
        local_98[0] = 0x29;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code&>
                  (this->m_alerts,this_02,local_98,&local_a8);
      }
      local_a8.val_ = 0;
      local_a8.failed_ = false;
      local_a8.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    }
    listen_socket_handle::get_local_endpoint((endpoint *)&local_78.base,&this->m_listen_socket);
    if (local_78.base.sa_family == 2) {
      local_98._0_8_ = local_78._0_8_ & 0xffffffff00000000;
      local_98[8] = '\0';
      local_98[9] = '\0';
      local_98[10] = '\0';
      local_98[0xb] = '\0';
      local_98[0xc] = '\0';
      local_98[0xd] = '\0';
      local_98[0xe] = '\0';
      local_98[0xf] = '\0';
      local_98._16_8_ = 0;
      local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_98[8] = local_78.base.sa_data[6];
      local_98[9] = local_78.base.sa_data[7];
      local_98[10] = local_78.base.sa_data[8];
      local_98[0xb] = local_78.base.sa_data[9];
      local_98[0xc] = local_78.base.sa_data[10];
      local_98[0xd] = local_78.base.sa_data[0xb];
      local_98[0xe] = local_78.base.sa_data[0xc];
      local_98[0xf] = local_78.base.sa_data[0xd];
      local_98._16_8_ = local_78._16_8_;
      local_80._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)local_78.v6.sin6_scope_id;
      local_98._0_8_ = 1;
    }
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::tcp> *)local_50,(address *)local_98,0);
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::bind
              ((this_00->
               super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               ).
               super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .impl_.service_,(int)impl,(sockaddr *)local_50,(socklen_t)&local_a8);
    if (local_a8.failed_ != true) {
      ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::socks5,void>
                ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_78.base,
                 (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_98._0_8_ = on_connected;
      local_98[8] = '\0';
      local_98[9] = '\0';
      local_98[10] = '\0';
      local_98[0xb] = '\0';
      local_98[0xc] = '\0';
      local_98[0xd] = '\0';
      local_98[0xe] = '\0';
      local_98[0xf] = '\0';
      local_98._16_8_ = local_78._0_8_;
      local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.v4.sin_zero;
      local_78._0_8_ = 0;
      local_78.base.sa_data[6] = '\0';
      local_78.base.sa_data[7] = '\0';
      local_78.base.sa_data[8] = '\0';
      local_78.base.sa_data[9] = '\0';
      local_78.base.sa_data[10] = '\0';
      local_78.base.sa_data[0xb] = '\0';
      local_78.base.sa_data[0xc] = '\0';
      local_78.base.sa_data[0xd] = '\0';
      boost::asio::
      basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
      ::
      async_connect<std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                ((basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  *)this_00,this_02,
                 (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                  *)local_98);
      if ((uchar  [8])local_80._M_pi != (uchar  [8])0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
      }
      if (local_78.v4.sin_zero != (uchar  [8])0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.v4.sin_zero);
      }
      local_98._0_8_ = 10000000000;
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::expires_after(&this->m_timer,(duration *)local_98);
      ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::socks5,void>
                ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_78.base,
                 (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_98._0_8_ = on_connect_timeout;
      local_98[8] = '\0';
      local_98[9] = '\0';
      local_98[10] = '\0';
      local_98[0xb] = '\0';
      local_98[0xc] = '\0';
      local_98[0xd] = '\0';
      local_98[0xe] = '\0';
      local_98[0xf] = '\0';
      local_98._16_8_ = local_78._0_8_;
      local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.v4.sin_zero;
      local_78._0_8_ = 0;
      local_78.base.sa_data[6] = '\0';
      local_78.base.sa_data[7] = '\0';
      local_78.base.sa_data[8] = '\0';
      local_78.base.sa_data[9] = '\0';
      local_78.base.sa_data[10] = '\0';
      local_78.base.sa_data[0xb] = '\0';
      local_78.base.sa_data[0xc] = '\0';
      local_78.base.sa_data[0xd] = '\0';
      boost::asio::detail::
      deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
      ::
      async_wait<std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                ((deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                  *)(this->m_timer).impl_.service_,&(this->m_timer).impl_.implementation_,
                 (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                  *)local_98,&(this->m_timer).impl_.executor_);
      if ((uchar  [8])local_80._M_pi != (uchar  [8])0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
      }
      if (local_78.v4.sin_zero == (uchar  [8])0x0) {
        return;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.v4.sin_zero);
      return;
    }
    if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0) {
      local_98[0] = 0xd;
      alert_manager::
      emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code&>
                (this->m_alerts,this_02,local_98,&local_a8);
    }
  }
LAB_00384c75:
  this->m_failures = this->m_failures + 1;
  retry_connection(this);
  return;
}

Assistant:

void socks5::on_name_lookup(error_code const& e, std::vector<address> const& ips)
{
	COMPLETE_ASYNC("socks5::on_name_lookup");

	if (m_abort) return;

	if (e == boost::asio::error::operation_aborted) return;

	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_listen_socket.get_local_endpoint()
				, operation_t::hostname_lookup, e);
		++m_failures;
		retry_connection();
		return;
	}

	// only set up a SOCKS5 tunnel for sockets with the same address family
	// as the proxy
	// this is a hack to mitigate excessive SOCKS5 tunnels, until this can get
	// fixed properly.
	auto const i = std::find_if(ips.begin(), ips.end()
		, [&](address const& a) {
			return m_listen_socket.can_route(a);
		});

	if (i == ips.end())
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_listen_socket.get_local_endpoint()
				, operation_t::hostname_lookup
				, error_code(boost::system::errc::host_unreachable, generic_category()));
		++m_failures;
		retry_connection();
		return;
	}

	m_proxy_addr.address(*i);

	error_code ec;
	m_socks5_sock.open(aux::is_v4(m_proxy_addr) ? tcp::v4() : tcp::v6(), ec);
	if (ec)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_open, ec);
		return;
	}

	// enable keep-alives
	m_socks5_sock.set_option(boost::asio::socket_base::keep_alive(true), ec);
	if (ec)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_option, ec);
		ec.clear();
	}

#if defined _WIN32 && !defined TORRENT_BUILD_SIMULATOR
	SOCKET sock = m_socks5_sock.native_handle();
	DWORD bytes = 0;
	tcp_keepalive timeout{};
	timeout.onoff = TRUE;
	timeout.keepalivetime = 30;
	timeout.keepaliveinterval = 30;
	auto const ret = WSAIoctl(sock, SIO_KEEPALIVE_VALS, &timeout, sizeof(timeout)
		, nullptr, 0, &bytes, nullptr, nullptr);
	if (ret != 0)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_option
				, error_code(WSAGetLastError(), system_category()));
	}
#else
#if defined TORRENT_HAS_KEEPALIVE_IDLE
	// set keepalive timeouts
	m_socks5_sock.set_option(aux::tcp_keepalive_idle(30), ec);
	if (ec)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_option, ec);
		ec.clear();
	}
#endif
#ifdef TORRENT_HAS_KEEPALIVE_INTERVAL
	m_socks5_sock.set_option(aux::tcp_keepalive_interval(1), ec);
	if (ec)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_option, ec);
		ec.clear();
	}
#endif
#endif

	tcp::endpoint const bind_ep(m_listen_socket.get_local_endpoint().address(), 0);
	m_socks5_sock.bind(bind_ep, ec);
	if (ec)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_bind, ec);
		++m_failures;
		retry_connection();
		return;
	}

	// TODO: perhaps an attempt should be made to bind m_socks5_sock to the
	// device of m_listen_socket

	ADD_OUTSTANDING_ASYNC("socks5::on_connected");
	m_socks5_sock.async_connect(m_proxy_addr
		, std::bind(&socks5::on_connected, self(), _1));

	ADD_OUTSTANDING_ASYNC("socks5::on_connect_timeout");
	m_timer.expires_after(seconds(10));
	m_timer.async_wait(std::bind(&socks5::on_connect_timeout
		, self(), _1));
}